

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# limbo.cpp
# Opt level: O0

vector<field::GF2E,_std::allocator<field::GF2E>_> *
anon_unknown.dwarf_3699c::phase_1_expand
          (limbo_instance_t *instance,vector<unsigned_char,_std::allocator<unsigned_char>_> *h_1,
          uint nbChallenges)

{
  vector<field::GF2E,_std::allocator<field::GF2E>_> *this;
  ulong __n;
  uint in_ECX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDX;
  long in_RSI;
  vector<field::GF2E,_std::allocator<field::GF2E>_> *in_RDI;
  size_t e;
  vector<unsigned_char,_std::allocator<unsigned_char>_> lambda_sized_buffer;
  hash_context ctx;
  vector<field::GF2E,_std::allocator<field::GF2E>_> *r_ejs;
  uint8_t *in_stack_fffffffffffffe20;
  hash_context *in_stack_fffffffffffffe28;
  allocator_type *in_stack_fffffffffffffe38;
  size_type in_stack_fffffffffffffe40;
  vector<field::GF2E,_std::allocator<field::GF2E>_> *in_stack_fffffffffffffe48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  vector<field::GF2E,_std::allocator<field::GF2E>_> *__n_00;
  ulong local_180;
  undefined1 local_171 [48];
  byte local_141;
  uint local_4c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_48;
  long local_40;
  
  __n_00 = in_RDI;
  local_4c = in_ECX;
  local_48 = in_RDX;
  local_40 = in_RSI;
  hash_init(in_stack_fffffffffffffe28,(size_t)in_stack_fffffffffffffe20);
  this = (vector<field::GF2E,_std::allocator<field::GF2E>_> *)
         std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1171c7);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_48);
  hash_update(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,0x1171eb);
  hash_final((hash_context *)0x1171f5);
  local_141 = 0;
  std::allocator<field::GF2E>::allocator((allocator<field::GF2E> *)0x11721b);
  std::vector<field::GF2E,_std::allocator<field::GF2E>_>::vector
            (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
             (allocator_type *)in_stack_fffffffffffffe38);
  std::allocator<field::GF2E>::~allocator((allocator<field::GF2E> *)0x11723e);
  __n = (ulong)*(uint *)(local_40 + 0x24);
  this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_171;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x11725d);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (this_00,__n,in_stack_fffffffffffffe38);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x11727d);
  std::vector<field::GF2E,_std::allocator<field::GF2E>_>::reserve(this,(size_type)__n_00);
  for (local_180 = 0; local_180 < local_4c; local_180 = local_180 + 1) {
    in_stack_fffffffffffffe38 =
         (allocator_type *)
         std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1172c3);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_171 + 1));
    hash_squeeze(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,0x1172e7);
    in_stack_fffffffffffffe28 =
         (hash_context *)
         std::vector<field::GF2E,_std::allocator<field::GF2E>_>::operator[](in_RDI,local_180);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x117307);
    field::GF2E::from_bytes((GF2E *)in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  }
  local_141 = 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe38);
  if ((local_141 & 1) == 0) {
    std::vector<field::GF2E,_std::allocator<field::GF2E>_>::~vector
              ((vector<field::GF2E,_std::allocator<field::GF2E>_> *)in_stack_fffffffffffffe38);
  }
  return __n_00;
}

Assistant:

std::vector<field::GF2E> phase_1_expand(const limbo_instance_t &instance,
                                        const std::vector<uint8_t> &h_1,
                                        unsigned int nbChallenges) {
  hash_context ctx;
  hash_init(&ctx, instance.digest_size);
  hash_update(&ctx, h_1.data(), h_1.size());
  hash_final(&ctx);

  std::vector<field::GF2E> r_ejs(nbChallenges);
  std::vector<uint8_t> lambda_sized_buffer(instance.lambda);
  r_ejs.reserve(instance.num_rounds);
  for (size_t e = 0; e < nbChallenges; e++) {
    hash_squeeze(&ctx, lambda_sized_buffer.data(), lambda_sized_buffer.size());
    r_ejs[e].from_bytes(lambda_sized_buffer.data());
  }
  return r_ejs;
}